

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain_as_is(ngx_output_chain_ctx_t *ctx,ngx_buf_t *buf)

{
  byte bVar1;
  ngx_uint_t sendfile;
  ngx_buf_t *buf_local;
  ngx_output_chain_ctx_t *ctx_local;
  
  if ((((((*(ushort *)&buf->field_0x48 >> 5 & 1) == 0) &&
        ((*(ushort *)&buf->field_0x48 >> 7 & 1) == 0)) &&
       ((*(ushort *)&buf->field_0x48 >> 6 & 1) == 0)) ||
      (((*(ushort *)&buf->field_0x48 & 1) != 0 || ((*(ushort *)&buf->field_0x48 >> 1 & 1) != 0))))
     || (((*(ushort *)&buf->field_0x48 >> 2 & 1) != 0 ||
         ((*(ushort *)&buf->field_0x48 >> 4 & 1) != 0)))) {
    if (((*(ushort *)&buf->field_0x48 >> 4 & 1) == 0) ||
       (((byte)buf->file->field_0xc0 >> 1 & 1) == 0)) {
      bVar1 = ctx->field_0x20 & 1;
      if (((*(ushort *)&buf->field_0x48 >> 4 & 1) != 0) && (0x7fffffff < buf->file_pos)) {
        bVar1 = 0;
      }
      if (bVar1 == 0) {
        if ((((*(ushort *)&buf->field_0x48 & 1) == 0) &&
            ((*(ushort *)&buf->field_0x48 >> 1 & 1) == 0)) &&
           ((*(ushort *)&buf->field_0x48 >> 2 & 1) == 0)) {
          return 0;
        }
        *(ushort *)&buf->field_0x48 = *(ushort *)&buf->field_0x48 & 0xffef;
      }
      if (((((byte)ctx->field_0x20 >> 3 & 1) == 0) || ((*(ushort *)&buf->field_0x48 & 1) != 0)) ||
         (((*(ushort *)&buf->field_0x48 >> 1 & 1) != 0 ||
          ((*(ushort *)&buf->field_0x48 >> 2 & 1) != 0)))) {
        if ((((byte)ctx->field_0x20 >> 4 & 1) == 0) ||
           (((*(ushort *)&buf->field_0x48 >> 1 & 1) == 0 &&
            ((*(ushort *)&buf->field_0x48 >> 2 & 1) == 0)))) {
          ctx_local = (ngx_output_chain_ctx_t *)&DAT_00000001;
        }
        else {
          ctx_local = (ngx_output_chain_ctx_t *)0x0;
        }
      }
      else {
        ctx_local = (ngx_output_chain_ctx_t *)0x0;
      }
    }
    else {
      ctx_local = (ngx_output_chain_ctx_t *)0x0;
    }
  }
  else {
    ctx_local = (ngx_output_chain_ctx_t *)&DAT_00000001;
  }
  return (ngx_int_t)ctx_local;
}

Assistant:

static ngx_inline ngx_int_t
ngx_output_chain_as_is(ngx_output_chain_ctx_t *ctx, ngx_buf_t *buf)
{
    ngx_uint_t  sendfile;

    if (ngx_buf_special(buf)) {
        return 1;
    }

#if (NGX_THREADS)
    if (buf->in_file) {
        buf->file->thread_handler = ctx->thread_handler;
        buf->file->thread_ctx = ctx->filter_ctx;
    }
#endif

    if (buf->in_file && buf->file->directio) {
        return 0;
    }

    sendfile = ctx->sendfile;

#if (NGX_SENDFILE_LIMIT)

    if (buf->in_file && buf->file_pos >= NGX_SENDFILE_LIMIT) {
        sendfile = 0;
    }

#endif

    if (!sendfile) {

        if (!ngx_buf_in_memory(buf)) {
            return 0;
        }

        buf->in_file = 0;
    }

#if (NGX_HAVE_AIO_SENDFILE)
    if (ctx->aio_preload && buf->in_file) {
        (void) ngx_output_chain_aio_setup(ctx, buf->file);
    }
#endif

    if (ctx->need_in_memory && !ngx_buf_in_memory(buf)) {
        return 0;
    }

    if (ctx->need_in_temp && (buf->memory || buf->mmap)) {
        return 0;
    }

    return 1;
}